

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_palette_colors_uv(MACROBLOCKD *xd,PALETTE_MODE_INFO *pmi,int bit_depth,aom_writer *w)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int in_EDX;
  long in_RSI;
  int i_2;
  int sign_bit;
  int delta;
  int i_1;
  int rate_using_raw;
  int rate_using_delta;
  int bits_v;
  int min_bits_v;
  int zero_count;
  int max_val;
  int found;
  int i;
  int n_in_cache;
  int n_out_cache;
  uint8_t cache_color_found [16];
  int out_cache_colors [8];
  int n_cache;
  uint16_t color_cache [16];
  uint16_t *colors_v;
  uint16_t *colors_u;
  int n;
  int in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  int local_c4;
  uint in_stack_ffffffffffffff48;
  int iVar8;
  int bit_depth_00;
  int iVar9;
  byte local_98 [8];
  int *in_stack_ffffffffffffff70;
  aom_writer *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  MACROBLOCKD *in_stack_ffffffffffffff98;
  
  uVar3 = (uint)*(byte *)(in_RSI + 0x31);
  lVar7 = in_RSI + 0x20;
  iVar4 = av1_get_palette_cache
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                     (uint16_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  iVar5 = av1_index_color_cache
                    ((uint16_t *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                     (uint16_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     in_stack_ffffffffffffff84,(uint8_t *)in_stack_ffffffffffffff78,
                     in_stack_ffffffffffffff70);
  iVar9 = 0;
  bit_depth_00 = 0;
  while( true ) {
    uVar6 = in_stack_ffffffffffffff2c & 0xffffff;
    if (bit_depth_00 < iVar4) {
      uVar6 = CONCAT13(iVar9 < (int)uVar3,(int3)in_stack_ffffffffffffff2c);
    }
    in_stack_ffffffffffffff2c = uVar6;
    if ((char)(in_stack_ffffffffffffff2c >> 0x18) == '\0') break;
    bVar1 = local_98[bit_depth_00];
    aom_write_bit((aom_writer *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                  in_stack_ffffffffffffff2c);
    iVar9 = (uint)bVar1 + iVar9;
    bit_depth_00 = bit_depth_00 + 1;
  }
  delta_encode_palette_colors
            ((int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
             in_stack_ffffffffffffff78);
  uVar6 = 1 << ((byte)in_EDX & 0x1f);
  iVar8 = 0;
  iVar4 = av1_get_palette_delta_bits_v
                    ((PALETTE_MODE_INFO *)CONCAT44(iVar5,iVar9),bit_depth_00,
                     (int *)((ulong)uVar6 << 0x20),(int *)(ulong)in_stack_ffffffffffffff48);
  if ((int)((in_EDX + 2 + (iVar4 + 1) * (uVar3 - 1)) - iVar8) < (int)(in_EDX * uVar3)) {
    aom_write_bit((aom_writer *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                  in_stack_ffffffffffffff2c);
    aom_write_literal((aom_writer *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    aom_write_literal((aom_writer *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                      in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    for (local_c4 = 1; local_c4 < (int)uVar3; local_c4 = local_c4 + 1) {
      if (*(short *)(lVar7 + (long)local_c4 * 2) == *(short *)(lVar7 + (long)(local_c4 + -1) * 2)) {
        aom_write_literal((aom_writer *)
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
      }
      else {
        iVar4 = (uint)*(ushort *)(lVar7 + (long)local_c4 * 2) -
                (uint)*(ushort *)(lVar7 + (long)(local_c4 + -1) * 2);
        if (iVar4 < 1) {
          iVar4 = -iVar4;
        }
        bVar2 = *(ushort *)(lVar7 + (long)local_c4 * 2) <
                *(ushort *)(lVar7 + (long)(local_c4 + -1) * 2);
        in_stack_ffffffffffffff34 = (uint)bVar2;
        if ((int)(uVar6 - iVar4) < iVar4) {
          aom_write_literal((aom_writer *)(ulong)CONCAT14(bVar2,in_stack_ffffffffffffff30),
                            in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
          aom_write_bit((aom_writer *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        in_stack_ffffffffffffff2c);
        }
        else {
          aom_write_literal((aom_writer *)(ulong)CONCAT14(bVar2,in_stack_ffffffffffffff30),
                            in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
          aom_write_bit((aom_writer *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        in_stack_ffffffffffffff2c);
        }
      }
    }
  }
  else {
    aom_write_bit((aom_writer *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                  in_stack_ffffffffffffff2c);
    for (iVar4 = 0; iVar4 < (int)uVar3; iVar4 = iVar4 + 1) {
      aom_write_literal((aom_writer *)CONCAT44(in_stack_ffffffffffffff34,iVar4),
                        in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    }
  }
  return;
}

Assistant:

static inline void write_palette_colors_uv(const MACROBLOCKD *const xd,
                                           const PALETTE_MODE_INFO *const pmi,
                                           int bit_depth, aom_writer *w) {
  const int n = pmi->palette_size[1];
  const uint16_t *colors_u = pmi->palette_colors + PALETTE_MAX_SIZE;
  const uint16_t *colors_v = pmi->palette_colors + 2 * PALETTE_MAX_SIZE;
  // U channel colors.
  uint16_t color_cache[2 * PALETTE_MAX_SIZE];
  const int n_cache = av1_get_palette_cache(xd, 1, color_cache);
  int out_cache_colors[PALETTE_MAX_SIZE];
  uint8_t cache_color_found[2 * PALETTE_MAX_SIZE];
  const int n_out_cache = av1_index_color_cache(
      color_cache, n_cache, colors_u, n, cache_color_found, out_cache_colors);
  int n_in_cache = 0;
  for (int i = 0; i < n_cache && n_in_cache < n; ++i) {
    const int found = cache_color_found[i];
    aom_write_bit(w, found);
    n_in_cache += found;
  }
  delta_encode_palette_colors(out_cache_colors, n_out_cache, bit_depth, 0, w);

  // V channel colors. Don't use color cache as the colors are not sorted.
  const int max_val = 1 << bit_depth;
  int zero_count = 0, min_bits_v = 0;
  int bits_v =
      av1_get_palette_delta_bits_v(pmi, bit_depth, &zero_count, &min_bits_v);
  const int rate_using_delta =
      2 + bit_depth + (bits_v + 1) * (n - 1) - zero_count;
  const int rate_using_raw = bit_depth * n;
  if (rate_using_delta < rate_using_raw) {  // delta encoding
    assert(colors_v[0] < (1 << bit_depth));
    aom_write_bit(w, 1);
    aom_write_literal(w, bits_v - min_bits_v, 2);
    aom_write_literal(w, colors_v[0], bit_depth);
    for (int i = 1; i < n; ++i) {
      assert(colors_v[i] < (1 << bit_depth));
      if (colors_v[i] == colors_v[i - 1]) {  // No need to signal sign bit.
        aom_write_literal(w, 0, bits_v);
        continue;
      }
      const int delta = abs((int)colors_v[i] - colors_v[i - 1]);
      const int sign_bit = colors_v[i] < colors_v[i - 1];
      if (delta <= max_val - delta) {
        aom_write_literal(w, delta, bits_v);
        aom_write_bit(w, sign_bit);
      } else {
        aom_write_literal(w, max_val - delta, bits_v);
        aom_write_bit(w, !sign_bit);
      }
    }
  } else {  // Transmit raw values.
    aom_write_bit(w, 0);
    for (int i = 0; i < n; ++i) {
      assert(colors_v[i] < (1 << bit_depth));
      aom_write_literal(w, colors_v[i], bit_depth);
    }
  }
}